

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O1

void deqp::gls::anon_unknown_1::genRandomCoords
               (Random *rng,vector<unsigned_char,_std::allocator<unsigned_char>_> *coords,
               size_t offset,size_t size)

{
  deUint32 dVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  deUint8 indices [4];
  undefined8 local_3c;
  undefined4 local_34;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(coords,size);
  uVar8 = (uint)size;
  if (0 < (int)uVar8) {
    uVar7 = 0;
    do {
      dVar1 = deRandom_getUint32(&rng->m_rnd);
      bVar3 = (byte)dVar1 & 3;
      (coords->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar7] = bVar3 | bVar3 * '\x14' | (byte)dVar1 << 6;
      uVar7 = uVar7 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar7);
  }
  local_3c = CONCAT44(local_3c._4_4_,0xffaa5500);
  uVar7 = 0;
  do {
    uVar5 = (ulong)((uint)*(byte *)((long)&local_3c + uVar7) * 2);
    if (uVar5 < size + offset && offset <= uVar5) {
      (coords->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5 - offset] = -((byte)uVar7 & 1);
    }
    uVar5 = uVar5 + 1;
    if (uVar5 < size + offset && offset <= uVar5) {
      (coords->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5 - offset] = (uVar7 < 2) + 0xff;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 4);
  local_3c = 0xaa0000aa5555ff00;
  local_34 = 0xff5555;
  iVar6 = (int)offset;
  iVar4 = 0xc;
  if ((int)(uVar8 + iVar6) < 0xc) {
    iVar4 = uVar8 + iVar6;
  }
  if (iVar6 < iVar4) {
    lVar2 = (long)iVar6;
    do {
      (coords->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar2 - offset] = *(uchar *)((long)&local_3c + lVar2);
      lVar2 = lVar2 + 1;
    } while (iVar4 != lVar2);
  }
  return;
}

Assistant:

void genRandomCoords (de::Random rng, vector<deUint8>& coords, size_t offset, size_t size)
{
	const deUint8 bits		= 2;
	const deUint8 bitMask	= deUint8((0x1u << bits) - 1);

	coords.resize(size);

	for (int i = 0; i < (int)size; i++)
	{
		const deUint8 xBits = deUint8(rng.getUint32() & bitMask);
		coords[i] = extend2BitsToByte(xBits);
	}

	// Fill indices with nice quad
	{
		const deUint8 indices[] =
		{
			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x3u)
		};

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(indices); i++)
		{
			const deUint8	index	= indices[i];
			const size_t	posX	= (size_t(index) * 2) + 0;
			const size_t	posY	= (size_t(index) * 2) + 1;

			if (posX >= offset && posX < offset+size)
				coords[posX - offset] = ((i % 2) == 0 ? extend2BitsToByte(0x0u) : extend2BitsToByte(0x3u));

			if (posY >= offset && posY < offset+size)
				coords[posY - offset] = ((i / 2) == 1 ? extend2BitsToByte(0x3u) : extend2BitsToByte(0x0u));
		}
	}

	// Fill beginning of buffer
	{
		const deUint8 indices[] =
		{
			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x3u),
			extend2BitsToByte(0x1u),

			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x0u),

			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x1u),

			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x3u),
			extend2BitsToByte(0x0u)
		};

		for (int i = (int)offset; i < DE_LENGTH_OF_ARRAY(indices) && i < (int)(offset + size); i++)
			coords[i-offset] = indices[i];
	}
}